

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::ObjectGet(VirtualMachine *this)

{
  bool bVar1;
  pointer ppVar2;
  Variable VVar3;
  Variable VVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_true>
  local_38;
  iterator find;
  Variable first;
  Variable second;
  VirtualMachine *this_local;
  
  VVar3 = popOpStack(this);
  VVar4 = popOpStack(this);
  find.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_true>
  ._M_cur._0_4_ = VVar4.type;
  if ((VariableType)
      find.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_true>
      ._M_cur == Object) {
    if (VVar3.type == String) {
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>_>
           ::find(&(VVar4.field_1.objectValue)->properties,(key_type *)VVar3.field_1.objectValue);
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>_>
           ::end(&(VVar4.field_1.objectValue)->properties);
      bVar1 = std::__detail::operator==(&local_38,&local_40);
      if (bVar1) {
        pushUndefined(this);
      }
      else {
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_false,_true>
                               *)&local_38);
        VVar3._0_8_ = *(ulong *)&ppVar2->second & 0xffffffff;
        VVar3.field_1.integerValue = (ppVar2->second).field_1.integerValue;
        pushOpStack(this,VVar3);
      }
      advance(this);
    }
    else {
      pushUndefined(this);
      advance(this);
    }
  }
  else {
    pushUndefined(this);
    advance(this);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::ObjectGet() {

  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (first.type != VariableType::Object) {
    this->pushUndefined();
    this->advance();
    return;
  }

  if (second.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  auto find = first.objectValue->properties.find(*second.stringValue);

  if (find == first.objectValue->properties.end()) {
    this->pushUndefined();
  } else {
    this->pushOpStack(find->second);
  }

  this->advance();
}